

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::Add
          (PersistentStorageJson *this,BorderRouter *aValue,BorderRouterId *aRetId)

{
  Status SVar1;
  string sStack_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,(string *)JSON_BR_SEQ_abi_cxx11_);
  std::__cxx11::string::string((string *)&sStack_58,(string *)JSON_BR_abi_cxx11_);
  SVar1 = AddOne<ot::commissioner::persistent_storage::BorderRouter,ot::commissioner::persistent_storage::BorderRouterId>
                    (this,aValue,aRetId,&local_38,&sStack_58);
  std::__cxx11::string::~string((string *)&sStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return SVar1;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::Add(BorderRouter const &aValue, BorderRouterId &aRetId)
{
    return AddOne<BorderRouter, BorderRouterId>(aValue, aRetId, JSON_BR_SEQ, JSON_BR);
}